

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O2

bool __thiscall
Js::DictionaryTypeHandlerBase<unsigned_short>::IsObjTypeSpecEquivalentImpl<true>
          (DictionaryTypeHandlerBase<unsigned_short> *this,Type *type,EquivalentPropertyEntry *entry
          )

{
  bool bVar1;
  unsigned_short slotIndex;
  PropertyIndex PVar2;
  ScriptContext *this_00;
  PropertyRecord *local_30;
  PropertyRecord *propertyRecord;
  DictionaryPropertyDescriptor<unsigned_short> *descriptor;
  
  this_00 = Js::Type::GetScriptContext(type);
  local_30 = ScriptContext::GetPropertyNameLocked(this_00,entry->propertyId);
  bVar1 = JsUtil::
          BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::TryGetReference<Js::PropertyRecord_const*>
                    ((BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)(this->propertyMap).ptr,&local_30,
                     (DictionaryPropertyDescriptor<unsigned_short> **)&propertyRecord);
  if ((bVar1) &&
     (((ulong)(propertyRecord->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject & 0x800) == 0)) {
    if (((ulong)(propertyRecord->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject & 4) != 0) {
      return false;
    }
    slotIndex = DictionaryPropertyDescriptor<unsigned_short>::GetDataPropertyIndex<false>
                          ((DictionaryPropertyDescriptor<unsigned_short> *)propertyRecord);
    if ((slotIndex != 0xffff) &&
       (PVar2 = DynamicTypeHandler::AdjustValidSlotIndexForInlineSlots
                          (&this->super_DynamicTypeHandler,slotIndex), PVar2 != 0xffff)) {
      if (PVar2 != entry->slotIndex) {
        return false;
      }
      if (entry->isAuxSlot != (this->super_DynamicTypeHandler).inlineSlotCapacity <= slotIndex) {
        return false;
      }
      if (entry->mustBeWritable != true) {
        return true;
      }
      if (((ulong)(propertyRecord->super_FinalizableObject).super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject & 0x400) != 0) {
        if (((ulong)(propertyRecord->super_FinalizableObject).super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject & 0x28) == 8) {
          return true;
        }
        return false;
      }
      return false;
    }
  }
  if ((entry->slotIndex == 0xffff) && (entry->mustBeWritable == false)) {
    return true;
  }
  return false;
}

Assistant:

bool DictionaryTypeHandlerBase<T>::IsObjTypeSpecEquivalentImpl(const Type* type, const EquivalentPropertyEntry *entry)
    {
        ScriptContext* scriptContext = type->GetScriptContext();

        T absSlotIndex = Constants::NoSlot;
        PropertyIndex relSlotIndex = Constants::NoSlot;

        const PropertyRecord* propertyRecord =
            doLock ? scriptContext->GetPropertyNameLocked(entry->propertyId) : scriptContext->GetPropertyName(entry->propertyId);
        DictionaryPropertyDescriptor<T>* descriptor;
        if (this->propertyMap->TryGetReference(propertyRecord, &descriptor) && !(descriptor->Attributes & PropertyDeleted))
        {
            // We don't object type specialize accessors at this point, so if we see an accessor on an object we must have a mismatch.
            // When we add support for accessors we will need another bit on EquivalentPropertyEntry indicating whether we expect
            // a data or accessor property.
            if (descriptor->GetIsAccessor())
            {
                return false;
            }

            absSlotIndex = descriptor->template GetDataPropertyIndex<false>();
            if (absSlotIndex <= Constants::PropertyIndexMax)
            {
                relSlotIndex = AdjustValidSlotIndexForInlineSlots(static_cast<PropertyIndex>(absSlotIndex));
            }
        }

        if (relSlotIndex != Constants::NoSlot)
        {
            if (relSlotIndex != entry->slotIndex || ((absSlotIndex >= GetInlineSlotCapacity()) != entry->isAuxSlot))
            {
                return false;
            }

            if (entry->mustBeWritable && (!(descriptor->Attributes & PropertyWritable) || descriptor->IsOrMayBecomeFixed()))
            {
                return false;
            }
        }
        else
        {
            if (entry->slotIndex != Constants::NoSlot || entry->mustBeWritable)
            {
                return false;
            }
        }

        return true;
    }